

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::Delaunay::InvalidDimension::InvalidDimension
          (InvalidDimension *this,coord_index_t dimension,char *name,char *expected)

{
  ostream *poVar1;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"Invalid dimension: dimension ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," is not supported by the ");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1," algorithm. Supported dimension(s): ");
  std::operator<<(poVar1,expected);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::logic_error::logic_error(&this->super_logic_error,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  *(undefined ***)this = &PTR__logic_error_001ad7d8;
  return;
}

Assistant:

Delaunay::InvalidDimension::InvalidDimension(
        coord_index_t dimension,
        const char* name,
        const char* expected
    ) :
        std::logic_error(invalid_dimension_error(dimension, name, expected)) {
    }